

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O1

char * __thiscall google::protobuf::Mixin::_InternalParse(Mixin *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  byte bVar2;
  string *psVar3;
  bool bVar4;
  char *in_RCX;
  char *pcVar5;
  Arena *pAVar6;
  UnknownFieldSet *unknown;
  byte *pbVar7;
  internal *this_02;
  ArenaStringPtr *this_03;
  uint uVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  StringPiece str;
  byte *local_38;
  char *ptr_local;
  char *size;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->root_;
  this_03 = &this->name_;
  local_38 = (byte *)ptr;
  do {
    bVar4 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar4) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    uVar8 = (uint)bVar1;
    pbVar7 = local_38 + 1;
    if ((char)bVar1 < '\0') {
      bVar2 = *pbVar7;
      in_RCX = (char *)((ulong)bVar2 << 7);
      uVar8 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar9 = internal::ReadTagFallback((char *)local_38,uVar8);
        pbVar7 = (byte *)pVar9.first;
        uVar8 = pVar9.second;
      }
      else {
        pbVar7 = local_38 + 2;
      }
    }
    local_38 = pbVar7;
    if (pbVar7 == (byte *)0x0) {
      in_RCX = (char *)0x4;
    }
    else {
      if (uVar8 >> 3 == 2) {
        if ((char)uVar8 != '\x12') goto LAB_0025cdce;
        pAVar6 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        if (this_01->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_01,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar3 = this_01->ptr_;
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar3,(char *)local_38,ctx);
        this_02 = (internal *)(psVar3->_M_dataplus)._M_p;
        size = (char *)psVar3->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar5 = "google.protobuf.Mixin.root";
      }
      else {
        if ((uVar8 >> 3 != 1) || ((char)uVar8 != '\n')) {
LAB_0025cdce:
          if (uVar8 == 0 || (uVar8 & 7) == 4) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
            in_RCX = (char *)0x7;
          }
          else {
            if (((ulong)this_00->ptr_ & 1) == 0) {
              unknown = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
            }
            else {
              unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
            }
            local_38 = (byte *)internal::UnknownFieldParse
                                         ((ulong)uVar8,unknown,(char *)local_38,ctx);
            in_RCX = (char *)(ulong)((uint)(local_38 == (byte *)0x0) * 2 + 2);
          }
          goto LAB_0025ce26;
        }
        pAVar6 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        if (this_03->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_03,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar3 = this_03->ptr_;
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar3,(char *)local_38,ctx);
        this_02 = (internal *)(psVar3->_M_dataplus)._M_p;
        size = (char *)psVar3->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar5 = "google.protobuf.Mixin.name";
      }
      str.length_ = (stringpiece_ssize_type)pcVar5;
      str.ptr_ = size;
      bVar4 = internal::VerifyUTF8(this_02,str,in_RCX);
      uVar8 = (uint)(local_38 == (byte *)0x0) * 2 + 2;
      if (!bVar4) {
        uVar8 = 4;
      }
      in_RCX = (char *)(ulong)uVar8;
    }
LAB_0025ce26:
    if ((int)in_RCX != 2) {
      if ((int)in_RCX == 4) {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* Mixin::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Mixin.name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string root = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          auto str = _internal_mutable_root();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Mixin.root"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}